

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O2

Token * __thiscall EOPlus::Lexer::ReadNumber(Token *__return_storage_ptr__,Lexer *this)

{
  variant *pvVar1;
  bool bVar2;
  int iVar3;
  int i;
  char c;
  Token *local_f8;
  code *local_f0 [2];
  code *local_e0;
  code *local_d8;
  function<bool_(char)> local_d0;
  variant local_b0;
  variant local_70;
  
  local_d0.super__Function_base._M_functor._8_8_ = 0;
  c = '\0';
  local_d0.super__Function_base._M_functor._M_unused._M_object = ctype_digit;
  local_d0._M_invoker = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_d0.super__Function_base._M_manager =
       std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar2 = GetCharIf(this,&c,&local_d0);
  std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  if (bVar2) {
    i = c + -0x30;
    local_f8 = __return_storage_ptr__;
    while( true ) {
      local_f0[1] = (code *)0x0;
      local_f0[0] = ctype_digit;
      local_d8 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
      local_e0 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
      bVar2 = GetCharIf(this,&c,(function<bool_(char)> *)local_f0);
      std::_Function_base::~_Function_base((_Function_base *)local_f0);
      if (!bVar2) break;
      iVar3 = i * 10 + -0x30;
      if (0xccccccc < i) {
        iVar3 = -0x3a;
      }
      i = iVar3 + c;
    }
    util::variant::variant(&local_b0,i);
    __return_storage_ptr__ = local_f8;
    Token::Token(local_f8,Integer,&local_b0);
    pvVar1 = &local_b0;
  }
  else {
    util::variant::variant(&local_70);
    Token::Token(__return_storage_ptr__,Invalid,&local_70);
    pvVar1 = &local_70;
  }
  std::__cxx11::string::~string((string *)&pvVar1->val_string);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadNumber()
	{
		char c = '\0';

		if (!this->GetCharIf(c, ctype_digit))
			return Token();

		int number = (c - '0');

		while (this->GetCharIf(c, ctype_digit))
		{
			if (number > std::numeric_limits<int>::max() / 10)
				number = std::numeric_limits<int>::max();

			number *= 10;
			number += (c - '0');
		}

		return Token(Token::Integer, number);
	}